

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O3

void __thiscall
asmjit::v1_14::BaseBuilder::removeNodes(BaseBuilder *this,BaseNode *first,BaseNode *last)

{
  BaseNode BVar1;
  BaseNode *pBVar2;
  long *plVar3;
  bool bVar4;
  long *plVar5;
  BaseNode *pBVar6;
  bool bVar7;
  
  if (first == last) {
    removeNode(this,first);
    return;
  }
  if ((char)first[0x11] < '\0') {
    pBVar2 = *(BaseNode **)first;
    plVar3 = *(long **)(last + 8);
    pBVar6 = pBVar2 + 8;
    if (*(BaseNode **)&this->_nodeList == first) {
      pBVar6 = (BaseNode *)&this->_nodeList;
    }
    *(long **)pBVar6 = plVar3;
    plVar5 = (long *)&this->field_0x1a8;
    if (*(BaseNode **)&this->field_0x1a8 != last) {
      plVar5 = plVar3;
    }
    *plVar5 = (long)pBVar2;
    bVar4 = false;
    do {
      pBVar6 = *(BaseNode **)(first + 8);
      if (pBVar6 == (BaseNode *)0x0) {
        removeNodes();
        this->_cursor = first;
        return;
      }
      *(undefined8 *)first = 0;
      *(undefined8 *)(first + 8) = 0;
      first[0x11] = (BaseNode)((byte)first[0x11] & 0x7f);
      BVar1 = first[0x10];
      if (this->_cursor == first) {
        this->_cursor = pBVar2;
      }
      bVar4 = (bool)(bVar4 | BVar1 == (BaseNode)0x2);
      bVar7 = first != last;
      first = pBVar6;
    } while (bVar7);
    if (bVar4) {
      this->_dirtySectionLinks = true;
    }
  }
  return;
}

Assistant:

void BaseBuilder::removeNodes(BaseNode* first, BaseNode* last) noexcept {
  if (first == last) {
    removeNode(first);
    return;
  }

  if (!first->isActive())
    return;

  BaseNode* prev = first->prev();
  BaseNode* next = last->next();

  if (_nodeList._first == first)
    _nodeList._first = next;
  else
    prev->_next = next;

  if (_nodeList._last == last)
    _nodeList._last  = prev;
  else
    next->_prev = prev;

  BaseNode* node = first;
  uint32_t didRemoveSection = false;

  for (;;) {
    next = node->next();
    ASMJIT_ASSERT(next != nullptr);

    node->_prev = nullptr;
    node->_next = nullptr;
    node->clearFlags(NodeFlags::kIsActive);
    didRemoveSection |= uint32_t(node->isSection());

    if (_cursor == node)
      _cursor = prev;

    if (node == last)
      break;
    node = next;
  }

  if (didRemoveSection)
    _dirtySectionLinks = true;
}